

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

float * hdr_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  stbi_uc *psVar9;
  int *piVar10;
  ulong uVar11;
  int req_comp_00;
  long lVar12;
  char *pcVar13;
  int iVar14;
  stbi_uc *input;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  char buffer [1024];
  undefined4 local_4ac;
  float *local_4a8;
  float *local_4a0;
  int *local_498;
  int *local_490;
  stbi_uc *local_488;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  long local_460;
  ulong local_458;
  ulong local_450;
  char *local_448;
  stbi_uc local_43c;
  undefined1 local_43b;
  undefined1 local_43a;
  undefined1 local_439;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  hdr_gettoken(s,&local_438);
  if (CONCAT17(cStack_42e,
               CONCAT16(cStack_42f,
                        CONCAT15(cStack_430,
                                 CONCAT14(cStack_431,
                                          CONCAT13(cStack_432,
                                                   CONCAT12(cStack_433,
                                                            CONCAT11(cStack_434,cStack_435))))))) ==
      0x45434e41494441 &&
      CONCAT17(cStack_431,
               CONCAT16(cStack_432,
                        CONCAT15(cStack_433,
                                 CONCAT14(cStack_434,
                                          CONCAT13(cStack_435,
                                                   CONCAT12(cStack_436,
                                                            CONCAT11(cStack_437,local_438))))))) ==
      0x4e41494441523f23) {
    local_498 = comp;
    hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar1 = false;
      local_490 = x;
      do {
        auVar15[0] = -(cStack_431 == '3');
        auVar15[1] = -(cStack_430 == '2');
        auVar15[2] = -(cStack_42f == '-');
        auVar15[3] = -(cStack_42e == 'b');
        auVar15[4] = -(cStack_42d == 'i');
        auVar15[5] = -(cStack_42c == 't');
        auVar15[6] = -(cStack_42b == '_');
        auVar15[7] = -(cStack_42a == 'r');
        auVar15[8] = -(cStack_429 == 'l');
        auVar15[9] = -(cStack_428 == 'e');
        auVar15[10] = -(cStack_427 == '_');
        auVar15[0xb] = -(cStack_426 == 'r');
        auVar15[0xc] = -(cStack_425 == 'g');
        auVar15[0xd] = -(cStack_424 == 'b');
        auVar15[0xe] = -(cStack_423 == 'e');
        auVar15[0xf] = -(cStack_422 == '\0');
        auVar16[0] = -(local_438 == 'F');
        auVar16[1] = -(cStack_437 == 'O');
        auVar16[2] = -(cStack_436 == 'R');
        auVar16[3] = -(cStack_435 == 'M');
        auVar16[4] = -(cStack_434 == 'A');
        auVar16[5] = -(cStack_433 == 'T');
        auVar16[6] = -(cStack_432 == '=');
        auVar16[7] = -(cStack_431 == '3');
        auVar16[8] = -(cStack_430 == '2');
        auVar16[9] = -(cStack_42f == '-');
        auVar16[10] = -(cStack_42e == 'b');
        auVar16[0xb] = -(cStack_42d == 'i');
        auVar16[0xc] = -(cStack_42c == 't');
        auVar16[0xd] = -(cStack_42b == '_');
        auVar16[0xe] = -(cStack_42a == 'r');
        auVar16[0xf] = -(cStack_429 == 'l');
        auVar16 = auVar16 & auVar15;
        if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        hdr_gettoken(s,&local_438);
        piVar10 = local_490;
      } while (local_438 != '\0');
      if ((bVar1) &&
         (hdr_gettoken(s,&local_438), cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d)
         ) {
        local_448 = &cStack_435;
        uVar6 = strtol(local_448,&local_448,10);
        local_448 = local_448 + 2;
        do {
          pcVar13 = local_448;
          local_448 = pcVar13 + 1;
        } while (pcVar13[-2] == ' ');
        if (((pcVar13[-2] == '+') && (pcVar13[-1] == 'X')) && (*pcVar13 == ' ')) {
          uVar7 = strtol(local_448,(char **)0x0,10);
          iVar2 = (int)uVar7;
          *piVar10 = iVar2;
          iVar3 = (int)uVar6;
          *y = iVar3;
          *local_498 = 3;
          req_comp_00 = 3;
          if (req_comp != 0) {
            req_comp_00 = req_comp;
          }
          iVar14 = 0;
          pfVar8 = (float *)malloc((long)(iVar3 * iVar2 * req_comp_00) << 2);
          if (iVar2 - 0x8000U < 0xffff8008) goto LAB_0010981c;
          local_4a8 = pfVar8;
          if (iVar3 < 1) {
            psVar9 = (stbi_uc *)0x0;
          }
          else {
            local_478 = (ulong)(uint)(iVar2 * 4);
            local_468 = uVar6 & 0x7fffffff;
            local_470 = uVar7 & 0x7fffffff;
            local_460 = (uVar7 & 0xffffffff) * (long)req_comp_00 * 4;
            local_498 = (int *)((long)req_comp_00 << 2);
            uVar11 = 0;
            psVar9 = (stbi_uc *)0x0;
            local_4a0 = pfVar8;
            local_480 = uVar6;
            local_450 = uVar7;
            do {
              local_458 = uVar11;
              iVar2 = get8(s);
              iVar3 = get8(s);
              uVar4 = get8(s);
              if (((iVar2 != 2) || (iVar3 != 2)) || ((uVar4 & 0x80) != 0)) {
                local_43c = (stbi_uc)iVar2;
                local_43b = (undefined1)iVar3;
                local_43a = (undefined1)uVar4;
                iVar2 = get8(s);
                pfVar8 = local_4a8;
                local_439 = (undefined1)iVar2;
                hdr_convert(local_4a8,&local_43c,req_comp_00);
                free(psVar9);
                iVar14 = 0;
                iVar2 = 1;
                uVar6 = local_480;
                do {
                  if ((FILE *)s->img_file == (FILE *)0x0) {
                    local_4ac = *(undefined4 *)s->img_buffer;
                    s->img_buffer = s->img_buffer + 4;
                  }
                  else {
                    fread(&local_4ac,1,4,(FILE *)s->img_file);
                  }
                  hdr_convert(pfVar8 + (long)(req_comp_00 * (int)uVar7 * iVar14) +
                                       (long)(iVar2 * req_comp_00),(stbi_uc *)&local_4ac,req_comp_00
                             );
                  iVar2 = iVar2 + 1;
                  while ((int)uVar7 <= iVar2) {
                    iVar14 = iVar14 + 1;
LAB_0010981c:
                    iVar2 = 0;
                    if ((int)uVar6 <= iVar14) {
                      return pfVar8;
                    }
                  }
                } while( true );
              }
              uVar5 = get8(s);
              if ((uVar5 | uVar4 << 8) != (uint)uVar7) {
                free(local_4a8);
                free(psVar9);
                failure_reason = "corrupt HDR";
                return (float *)0x0;
              }
              if (psVar9 == (stbi_uc *)0x0) {
                psVar9 = (stbi_uc *)malloc(local_478);
              }
              piVar10 = (int *)0x0;
              local_488 = psVar9;
              do {
                iVar2 = 0;
                local_490 = piVar10;
                do {
                  uVar4 = get8(s);
                  uVar5 = uVar4 & 0xff;
                  if (uVar5 < 0x81) {
                    if (uVar5 != 0) {
                      lVar12 = 0;
                      do {
                        iVar3 = get8(s);
                        psVar9[lVar12 * 4 + (long)iVar2 * 4] = (stbi_uc)iVar3;
                        lVar12 = lVar12 + 1;
                      } while ((uVar4 & 0xff) != (uint)lVar12);
                      iVar2 = iVar2 + (uint)lVar12;
                      uVar7 = local_450;
                    }
                  }
                  else {
                    iVar3 = get8(s);
                    lVar12 = 0;
                    do {
                      psVar9[lVar12 * 4 + (long)iVar2 * 4] = (stbi_uc)iVar3;
                      lVar12 = lVar12 + 1;
                    } while ((uVar5 ^ (uint)lVar12) != 0x80);
                    iVar2 = iVar2 + (uint)lVar12;
                  }
                } while (iVar2 < (int)uVar7);
                piVar10 = (int *)((long)local_490 + 1);
                psVar9 = psVar9 + 1;
                pfVar8 = local_4a0;
                input = local_488;
                uVar6 = local_470;
              } while (piVar10 != (int *)0x4);
              do {
                hdr_convert(pfVar8,input,req_comp_00);
                uVar6 = uVar6 - 1;
                pfVar8 = (float *)((long)pfVar8 + (long)local_498);
                input = input + 4;
              } while (uVar6 != 0);
              uVar11 = local_458 + 1;
              local_4a0 = (float *)((long)local_4a0 + local_460);
              psVar9 = local_488;
            } while (uVar11 != local_468);
          }
          free(psVar9);
          return local_4a8;
        }
      }
    }
    failure_reason = "Unsupported HDR format";
  }
  else {
    failure_reason = "Corrupt HDR image";
  }
  return (float *)0x0;
}

Assistant:

static float *hdr_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[HDR_BUFLEN];
	char *token;
	int valid = 0;
	int width, height;
   stbi_uc *scanline;
	float *hdr_data;
	int len;
	unsigned char count, value;
	int i, j, k, c1,c2, z;


	// Check identifier
	if (strcmp(hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
		return epf("not HDR", "Corrupt HDR image");

	// Parse header
	while(1) {
		token = hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
		if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

	if (!valid)    return epf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return epf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return epf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = strtol(token, NULL, 10);

	*x = width;
	*y = height;

   *comp = 3;
	if (req_comp == 0) req_comp = 3;

	// Read data
	hdr_data = (float *) malloc(height * width * req_comp * sizeof(float));

	// Load image data
   // image data is stored as some number of sca
	if( width < 8 || width >= 32768) {
		// Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            getn(s, rgbe, 4);
            hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
	} else {
		// Read RLE-encoded data
		scanline = NULL;

		for (j = 0; j < height; ++j) {
         c1 = get8(s);
         c2 = get8(s);
         len = get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4] = { c1,c2,len, get8(s) };
            hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            free(scanline);
            goto main_decode_loop; // yes, this is fucking insane; blame the fucking insane format
         }
         len <<= 8;
         len |= get8(s);
         if (len != width) { free(hdr_data); free(scanline); return epf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) malloc(width * 4);

			for (k = 0; k < 4; ++k) {
				i = 0;
				while (i < width) {
					count = get8(s);
					if (count > 128) {
						// Run
						value = get8(s);
                  count -= 128;
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = value;
					} else {
						// Dump
						for (z = 0; z < count; ++z)
							scanline[i++ * 4 + k] = get8(s);
					}
				}
			}
         for (i=0; i < width; ++i)
            hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
		}
      free(scanline);
	}

   return hdr_data;
}